

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O2

void __thiscall NULLCIO::WriteToConsole(NULLCIO *this,NULLCArray data)

{
  ulong uVar1;
  bool bVar2;
  
  if (this != (NULLCIO *)0x0 && writeFunc != (code *)0x0) {
    uVar1 = (ulong)(uint)data.ptr;
    for (; (bVar2 = uVar1 != 0, uVar1 = uVar1 - 1, bVar2 && (*this != (NULLCIO)0x0));
        this = this + 1) {
      (*writeFunc)(contextFunc,this,1);
    }
  }
  return;
}

Assistant:

void WriteToConsole(NULLCArray data)
	{
		if(!writeFunc)
			return;

		// Empty arrays are silently ignored
		if(!data.ptr)
			return;
		
		for(unsigned i = 0; i < data.len; i++)
		{
			if(!data.ptr[i])
				return;

			writeFunc(contextFunc, data.ptr + i, 1);
		}
	}